

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  long *iStart;
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  BYTE *pBVar7;
  BYTE *mEnd;
  U32 *pUVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  uint uVar12;
  undefined8 uVar13;
  char cVar14;
  char cVar15;
  uint uVar16;
  long *plVar17;
  size_t sVar18;
  seqDef *psVar19;
  byte bVar20;
  byte bVar22;
  byte bVar23;
  ulong uVar24;
  BYTE *pBVar25;
  BYTE *pBVar26;
  long lVar27;
  BYTE *litEnd;
  long *plVar28;
  long *plVar29;
  long *plVar30;
  uint uVar31;
  long *plVar32;
  ulong uVar33;
  ulong uVar34;
  int *piVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  U32 UVar44;
  size_t _size;
  BYTE *litEnd_1;
  U32 UVar45;
  BYTE *litEnd_6;
  long lVar46;
  long *plVar47;
  uint uVar48;
  U32 local_118;
  U32 local_114;
  BYTE *litLimit_w;
  BYTE *litLimit_w_6;
  char *_ptr;
  byte bVar21;
  
  pBVar5 = (ms->window).base;
  iEnd = (BYTE *)((long)src + srcSize);
  iVar41 = (int)pBVar5;
  iVar43 = (int)iEnd - iVar41;
  uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar3 = (ms->window).dictLimit;
  uVar12 = iVar43 - uVar16;
  if (iVar43 - uVar3 <= uVar16) {
    uVar12 = uVar3;
  }
  if (ms->loadedDictEnd != 0) {
    uVar12 = uVar3;
  }
  iStart = (long *)(pBVar5 + uVar12);
  plVar1 = (long *)((long)src + (srcSize - 8));
  pZVar6 = ms->dictMatchState;
  uVar3 = (pZVar6->window).dictLimit;
  pBVar7 = (pZVar6->window).base;
  plVar32 = (long *)(pBVar7 + uVar3);
  mEnd = (pZVar6->window).nextSrc;
  uVar31 = ((int)pBVar7 - (int)mEnd) + uVar12;
  pUVar8 = pZVar6->hashTable;
  pUVar9 = pZVar6->chainTable;
  iVar42 = ((int)src - ((int)iStart + (int)plVar32)) + (int)mEnd;
  uVar16 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  pUVar11 = ms->chainTable;
  iVar43 = ms->prefetchCDictTables;
  local_118 = *rep;
  local_114 = rep[1];
  uVar33 = (ulong)uVar31;
  bVar20 = (byte)(pZVar6->cParams).hashLog;
  bVar21 = (byte)(pZVar6->cParams).chainLog;
  cVar14 = (char)(ms->cParams).hashLog;
  cVar15 = (char)(ms->cParams).chainLog;
  if (uVar16 == 5) {
    if (iVar43 != 0) {
      for (uVar24 = 0; uVar24 < (ulong)(4L << (bVar20 & 0x3f)); uVar24 = uVar24 + 0x40) {
      }
      for (uVar24 = 0; uVar24 < (ulong)(4L << (bVar21 & 0x3f)); uVar24 = uVar24 + 0x40) {
      }
    }
    plVar28 = (long *)((long)src + (ulong)(iVar42 == 0));
    bVar22 = 0x40 - cVar14;
    bVar23 = 0x40 - cVar15;
    plVar17 = (long *)(iEnd + -0x20);
LAB_01f9fb20:
    if (plVar28 < plVar1) {
      lVar46 = *plVar28;
      uVar34 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
      uVar40 = (ulong)(lVar46 * -0x30e4432345000000) >> (bVar23 & 0x3f);
      uVar37 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (0x38 - bVar20 & 0x3f);
      uVar24 = (ulong)(lVar46 * -0x30e4432345000000) >> (0x38 - bVar21 & 0x3f);
      uVar16 = pUVar8[uVar37 >> 8];
      uVar36 = pUVar9[uVar24 >> 8];
      iVar43 = (int)plVar28;
      UVar45 = iVar43 - iVar41;
      uVar4 = pUVar10[uVar34];
      uVar48 = pUVar11[uVar40];
      UVar44 = UVar45 + 1;
      pUVar11[uVar40] = UVar45;
      uVar38 = UVar44 - local_118;
      pUVar10[uVar34] = UVar45;
      if ((uVar12 - 1) - uVar38 < 3) {
LAB_01f9fc25:
        if (uVar12 < uVar4) {
          plVar30 = (long *)(pBVar5 + uVar4);
          if (*plVar30 != lVar46) goto LAB_01f9fc65;
          sVar18 = ZSTD_count((BYTE *)(plVar28 + 1),(BYTE *)(plVar30 + 1),iEnd);
          lVar46 = sVar18 + 8;
          UVar44 = iVar43 - (int)plVar30;
          for (; ((iStart < plVar30 && (src < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
              plVar28 = (long *)((long)plVar28 + -1)) {
            plVar30 = (long *)((long)plVar30 + -1);
            lVar46 = lVar46 + 1;
          }
          goto LAB_01fa00b7;
        }
        if ((char)uVar37 == (char)uVar16) {
          uVar16 = uVar16 >> 8;
          if ((uVar3 < uVar16) && (*(long *)(pBVar7 + uVar16) == lVar46)) {
            plVar30 = (long *)(pBVar7 + uVar16);
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)(plVar28 + 1),pBVar7 + (ulong)uVar16 + 8,iEnd,mEnd,
                                (BYTE *)iStart);
            lVar46 = sVar18 + 8;
            UVar44 = UVar45 - (uVar16 + uVar31);
            for (; ((plVar32 < plVar30 && (src < plVar28)) &&
                   (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                plVar28 = (long *)((long)plVar28 + -1)) {
              plVar30 = (long *)((long)plVar30 + -1);
              lVar46 = lVar46 + 1;
            }
            goto LAB_01fa00b7;
          }
        }
LAB_01f9fc65:
        if (uVar12 < uVar48) {
          plVar30 = (long *)(pBVar5 + uVar48);
          if ((int)*plVar30 == (int)*plVar28) {
LAB_01f9fecc:
            lVar46 = *(long *)((long)plVar28 + 1);
            uVar34 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
            uVar24 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (0x38 - bVar20 & 0x3f);
            plVar29 = (long *)((long)plVar28 + 1);
            uVar16 = pUVar10[uVar34];
            uVar36 = pUVar8[uVar24 >> 8];
            pUVar10[uVar34] = UVar44;
            if (uVar12 < uVar16) {
              plVar47 = (long *)(pBVar5 + uVar16);
              if (*plVar47 != lVar46) goto LAB_01fa001c;
              sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 9),(BYTE *)(plVar47 + 1),iEnd);
              lVar46 = sVar18 + 8;
              UVar44 = (int)plVar29 - (int)plVar47;
              for (; ((plVar28 = plVar29, iStart < plVar47 && (src < plVar29)) &&
                     (*(BYTE *)((long)plVar29 + -1) == *(BYTE *)((long)plVar47 + -1)));
                  plVar29 = (long *)((long)plVar29 + -1)) {
                plVar47 = (long *)((long)plVar47 + -1);
                lVar46 = lVar46 + 1;
              }
            }
            else {
              if ((char)uVar24 == (char)uVar36) {
                uVar36 = uVar36 >> 8;
                if ((uVar3 < uVar36) && (plVar47 = (long *)(pBVar7 + uVar36), *plVar47 == lVar46)) {
                  sVar18 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar28 + 9),(BYTE *)(plVar47 + 1),iEnd,mEnd,
                                      (BYTE *)iStart);
                  lVar46 = sVar18 + 8;
                  UVar44 = UVar44 - (uVar36 + uVar31);
                  for (; ((plVar28 = plVar29, plVar32 < plVar47 && (src < plVar29)) &&
                         (*(BYTE *)((long)plVar29 + -1) == *(BYTE *)((long)plVar47 + -1)));
                      plVar29 = (long *)((long)plVar29 + -1)) {
                    plVar47 = (long *)((long)plVar47 + -1);
                    lVar46 = lVar46 + 1;
                  }
                  goto LAB_01fa00b7;
                }
              }
LAB_01fa001c:
              if (uVar48 < uVar12) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)plVar30 + 4),iEnd,
                                    mEnd,(BYTE *)iStart);
                lVar46 = sVar18 + 4;
                UVar44 = UVar45 - uVar48;
                for (; ((plVar32 < plVar30 && (src < plVar28)) &&
                       (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                    plVar28 = (long *)((long)plVar28 + -1)) {
                  plVar30 = (long *)((long)plVar30 + -1);
                  lVar46 = lVar46 + 1;
                }
              }
              else {
                sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 4),(BYTE *)((long)plVar30 + 4),iEnd);
                lVar46 = sVar18 + 4;
                UVar44 = iVar43 - (int)plVar30;
                for (; ((iStart < plVar30 && (src < plVar28)) &&
                       (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                    plVar28 = (long *)((long)plVar28 + -1)) {
                  plVar30 = (long *)((long)plVar30 + -1);
                  lVar46 = lVar46 + 1;
                }
              }
            }
LAB_01fa00b7:
            uVar24 = (long)plVar28 - (long)src;
            plVar30 = (long *)seqStore->lit;
            if (plVar17 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar30,(BYTE *)src,(BYTE *)plVar28,(BYTE *)plVar17);
LAB_01fa00e6:
              seqStore->lit = seqStore->lit + uVar24;
              psVar19 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              lVar27 = *(long *)((long)src + 8);
              *plVar30 = *src;
              plVar30[1] = lVar27;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                lVar27 = *(long *)((long)src + 0x18);
                *(long *)(pBVar25 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar25 + 0x18) = lVar27;
                if (0x20 < (long)uVar24) {
                  lVar27 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
                    uVar13 = puVar2[1];
                    pBVar26 = pBVar25 + lVar27 + 0x20;
                    *(undefined8 *)pBVar26 = *puVar2;
                    *(undefined8 *)(pBVar26 + 8) = uVar13;
                    puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
                    uVar13 = puVar2[1];
                    *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar26 + 0x18) = uVar13;
                    lVar27 = lVar27 + 0x20;
                  } while (pBVar26 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_01fa00e6;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar19 = seqStore->sequences;
            }
            psVar19->litLength = (U16)uVar24;
            psVar19->offBase = UVar44 + 3;
            uVar24 = lVar46 - 3;
            plVar30 = plVar28;
            local_114 = local_118;
            goto joined_r0x01fa01a2;
          }
        }
        else if ((char)uVar24 == (char)uVar36) {
          uVar36 = uVar36 >> 8;
          if ((uVar3 < uVar36) && (*(int *)(pBVar7 + uVar36) == (int)*plVar28)) {
            uVar48 = uVar36 + uVar31;
            plVar30 = (long *)(pBVar7 + uVar36);
            goto LAB_01f9fecc;
          }
        }
        plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + 1);
      }
      else {
        piVar35 = (int *)(pBVar5 + uVar38);
        if (uVar38 < uVar12) {
          piVar35 = (int *)(pBVar7 + (uVar38 - uVar31));
        }
        if (*piVar35 != *(int *)((long)plVar28 + 1)) goto LAB_01f9fc25;
        plVar30 = (long *)((long)plVar28 + 1);
        pBVar25 = iEnd;
        if (uVar38 < uVar12) {
          pBVar25 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar28 + 5),(BYTE *)(piVar35 + 1),iEnd,pBVar25,
                            (BYTE *)iStart);
        uVar24 = (long)plVar30 - (long)src;
        plVar28 = (long *)seqStore->lit;
        if (plVar17 < plVar30) {
          ZSTD_safecopyLiterals((BYTE *)plVar28,(BYTE *)src,(BYTE *)plVar30,(BYTE *)plVar17);
LAB_01f9fd23:
          seqStore->lit = seqStore->lit + uVar24;
          psVar19 = seqStore->sequences;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar46 = *(long *)((long)src + 8);
          *plVar28 = *src;
          plVar28[1] = lVar46;
          pBVar25 = seqStore->lit;
          if (0x10 < uVar24) {
            lVar46 = *(long *)((long)src + 0x18);
            *(long *)(pBVar25 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar25 + 0x18) = lVar46;
            if (0x20 < (long)uVar24) {
              lVar46 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar46 + 0x20);
                uVar13 = puVar2[1];
                pBVar26 = pBVar25 + lVar46 + 0x20;
                *(undefined8 *)pBVar26 = *puVar2;
                *(undefined8 *)(pBVar26 + 8) = uVar13;
                puVar2 = (undefined8 *)((long)src + lVar46 + 0x30);
                uVar13 = puVar2[1];
                *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar26 + 0x18) = uVar13;
                lVar46 = lVar46 + 0x20;
              } while (pBVar26 + 0x20 < pBVar25 + uVar24);
            }
            goto LAB_01f9fd23;
          }
          seqStore->lit = pBVar25 + uVar24;
          psVar19 = seqStore->sequences;
        }
        lVar46 = sVar18 + 4;
        psVar19->litLength = (U16)uVar24;
        psVar19->offBase = 1;
        uVar24 = sVar18 + 1;
        UVar44 = local_118;
joined_r0x01fa01a2:
        local_118 = UVar44;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar28 = (long *)(lVar46 + (long)plVar30);
        psVar19->mlBase = (U16)uVar24;
        seqStore->sequences = psVar19 + 1;
        src = plVar28;
        if (plVar28 <= plVar1) {
          uVar16 = UVar45 + 2;
          lVar46 = *(long *)(pBVar5 + uVar16);
          pUVar10[(ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar16;
          pUVar10[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
               ((int)plVar28 + -2) - iVar41;
          pUVar11[(ulong)(lVar46 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = uVar16;
          pUVar11[(ulong)(*(long *)((long)plVar28 + -1) * -0x30e4432345000000) >> (bVar23 & 0x3f)] =
               ((int)plVar28 + -1) - iVar41;
          UVar44 = local_114;
          for (; local_114 = UVar44, src = plVar28, plVar28 <= plVar1;
              plVar28 = (long *)((long)plVar28 + sVar18 + 4)) {
            UVar44 = (int)plVar28 - iVar41;
            uVar16 = UVar44 - local_114;
            pBVar25 = pBVar5;
            if (uVar16 < uVar12) {
              pBVar25 = pBVar7 + -uVar33;
            }
            if (((uVar12 - 1) - uVar16 < 3) || (*(int *)(pBVar25 + uVar16) != (int)*plVar28)) break;
            pBVar26 = iEnd;
            if (uVar16 < uVar12) {
              pBVar26 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)(pBVar25 + uVar16) + 4),
                                iEnd,pBVar26,(BYTE *)iStart);
            plVar30 = (long *)seqStore->lit;
            if (plVar17 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar30,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar17)
              ;
            }
            else {
              lVar46 = plVar28[1];
              *plVar30 = *plVar28;
              plVar30[1] = lVar46;
            }
            psVar19 = seqStore->sequences;
            psVar19->litLength = 0;
            psVar19->offBase = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar19->mlBase = (U16)(sVar18 + 1);
            seqStore->sequences = psVar19 + 1;
            lVar46 = *plVar28;
            pUVar11[(ulong)(lVar46 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = UVar44;
            pUVar10[(ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar44;
            UVar44 = local_118;
            local_118 = local_114;
          }
        }
      }
      goto LAB_01f9fb20;
    }
  }
  else if (uVar16 == 6) {
    if (iVar43 != 0) {
      for (uVar24 = 0; uVar24 < (ulong)(4L << (bVar20 & 0x3f)); uVar24 = uVar24 + 0x40) {
      }
      for (uVar24 = 0; uVar24 < (ulong)(4L << (bVar21 & 0x3f)); uVar24 = uVar24 + 0x40) {
      }
    }
    plVar28 = (long *)((long)src + (ulong)(iVar42 == 0));
    bVar22 = 0x40 - cVar14;
    bVar23 = 0x40 - cVar15;
    plVar17 = (long *)(iEnd + -0x20);
LAB_01f9f1ee:
    if (plVar28 < plVar1) {
      lVar46 = *plVar28;
      uVar34 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
      uVar40 = (ulong)(lVar46 * -0x30e4432340650000) >> (bVar23 & 0x3f);
      uVar37 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (0x38 - bVar20 & 0x3f);
      uVar24 = (ulong)(lVar46 * -0x30e4432340650000) >> (0x38 - bVar21 & 0x3f);
      uVar16 = pUVar8[uVar37 >> 8];
      uVar36 = pUVar9[uVar24 >> 8];
      iVar43 = (int)plVar28;
      UVar45 = iVar43 - iVar41;
      uVar4 = pUVar10[uVar34];
      uVar48 = pUVar11[uVar40];
      UVar44 = UVar45 + 1;
      pUVar11[uVar40] = UVar45;
      uVar38 = UVar44 - local_118;
      pUVar10[uVar34] = UVar45;
      if ((uVar12 - 1) - uVar38 < 3) {
LAB_01f9f2f3:
        if (uVar12 < uVar4) {
          plVar30 = (long *)(pBVar5 + uVar4);
          if (*plVar30 != lVar46) goto LAB_01f9f333;
          sVar18 = ZSTD_count((BYTE *)(plVar28 + 1),(BYTE *)(plVar30 + 1),iEnd);
          lVar46 = sVar18 + 8;
          UVar44 = iVar43 - (int)plVar30;
          for (; ((iStart < plVar30 && (src < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
              plVar28 = (long *)((long)plVar28 + -1)) {
            plVar30 = (long *)((long)plVar30 + -1);
            lVar46 = lVar46 + 1;
          }
          goto LAB_01f9f785;
        }
        if ((char)uVar37 == (char)uVar16) {
          uVar16 = uVar16 >> 8;
          if ((uVar3 < uVar16) && (*(long *)(pBVar7 + uVar16) == lVar46)) {
            plVar30 = (long *)(pBVar7 + uVar16);
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)(plVar28 + 1),pBVar7 + (ulong)uVar16 + 8,iEnd,mEnd,
                                (BYTE *)iStart);
            lVar46 = sVar18 + 8;
            UVar44 = UVar45 - (uVar16 + uVar31);
            for (; ((plVar32 < plVar30 && (src < plVar28)) &&
                   (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                plVar28 = (long *)((long)plVar28 + -1)) {
              plVar30 = (long *)((long)plVar30 + -1);
              lVar46 = lVar46 + 1;
            }
            goto LAB_01f9f785;
          }
        }
LAB_01f9f333:
        if (uVar12 < uVar48) {
          plVar30 = (long *)(pBVar5 + uVar48);
          if ((int)*plVar30 == (int)*plVar28) {
LAB_01f9f59a:
            lVar46 = *(long *)((long)plVar28 + 1);
            uVar34 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
            uVar24 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (0x38 - bVar20 & 0x3f);
            plVar29 = (long *)((long)plVar28 + 1);
            uVar16 = pUVar10[uVar34];
            uVar36 = pUVar8[uVar24 >> 8];
            pUVar10[uVar34] = UVar44;
            if (uVar12 < uVar16) {
              plVar47 = (long *)(pBVar5 + uVar16);
              if (*plVar47 != lVar46) goto LAB_01f9f6ea;
              sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 9),(BYTE *)(plVar47 + 1),iEnd);
              lVar46 = sVar18 + 8;
              UVar44 = (int)plVar29 - (int)plVar47;
              for (; ((plVar28 = plVar29, iStart < plVar47 && (src < plVar29)) &&
                     (*(BYTE *)((long)plVar29 + -1) == *(BYTE *)((long)plVar47 + -1)));
                  plVar29 = (long *)((long)plVar29 + -1)) {
                plVar47 = (long *)((long)plVar47 + -1);
                lVar46 = lVar46 + 1;
              }
            }
            else {
              if ((char)uVar24 == (char)uVar36) {
                uVar36 = uVar36 >> 8;
                if ((uVar3 < uVar36) && (plVar47 = (long *)(pBVar7 + uVar36), *plVar47 == lVar46)) {
                  sVar18 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar28 + 9),(BYTE *)(plVar47 + 1),iEnd,mEnd,
                                      (BYTE *)iStart);
                  lVar46 = sVar18 + 8;
                  UVar44 = UVar44 - (uVar36 + uVar31);
                  for (; ((plVar28 = plVar29, plVar32 < plVar47 && (src < plVar29)) &&
                         (*(BYTE *)((long)plVar29 + -1) == *(BYTE *)((long)plVar47 + -1)));
                      plVar29 = (long *)((long)plVar29 + -1)) {
                    plVar47 = (long *)((long)plVar47 + -1);
                    lVar46 = lVar46 + 1;
                  }
                  goto LAB_01f9f785;
                }
              }
LAB_01f9f6ea:
              if (uVar48 < uVar12) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)plVar30 + 4),iEnd,
                                    mEnd,(BYTE *)iStart);
                lVar46 = sVar18 + 4;
                UVar44 = UVar45 - uVar48;
                for (; ((plVar32 < plVar30 && (src < plVar28)) &&
                       (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                    plVar28 = (long *)((long)plVar28 + -1)) {
                  plVar30 = (long *)((long)plVar30 + -1);
                  lVar46 = lVar46 + 1;
                }
              }
              else {
                sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 4),(BYTE *)((long)plVar30 + 4),iEnd);
                lVar46 = sVar18 + 4;
                UVar44 = iVar43 - (int)plVar30;
                for (; ((iStart < plVar30 && (src < plVar28)) &&
                       (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                    plVar28 = (long *)((long)plVar28 + -1)) {
                  plVar30 = (long *)((long)plVar30 + -1);
                  lVar46 = lVar46 + 1;
                }
              }
            }
LAB_01f9f785:
            uVar24 = (long)plVar28 - (long)src;
            plVar30 = (long *)seqStore->lit;
            if (plVar17 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar30,(BYTE *)src,(BYTE *)plVar28,(BYTE *)plVar17);
LAB_01f9f7b4:
              seqStore->lit = seqStore->lit + uVar24;
              psVar19 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              lVar27 = *(long *)((long)src + 8);
              *plVar30 = *src;
              plVar30[1] = lVar27;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                lVar27 = *(long *)((long)src + 0x18);
                *(long *)(pBVar25 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar25 + 0x18) = lVar27;
                if (0x20 < (long)uVar24) {
                  lVar27 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
                    uVar13 = puVar2[1];
                    pBVar26 = pBVar25 + lVar27 + 0x20;
                    *(undefined8 *)pBVar26 = *puVar2;
                    *(undefined8 *)(pBVar26 + 8) = uVar13;
                    puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
                    uVar13 = puVar2[1];
                    *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar26 + 0x18) = uVar13;
                    lVar27 = lVar27 + 0x20;
                  } while (pBVar26 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_01f9f7b4;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar19 = seqStore->sequences;
            }
            psVar19->litLength = (U16)uVar24;
            psVar19->offBase = UVar44 + 3;
            uVar24 = lVar46 - 3;
            plVar30 = plVar28;
            local_114 = local_118;
            goto joined_r0x01f9f870;
          }
        }
        else if ((char)uVar24 == (char)uVar36) {
          uVar36 = uVar36 >> 8;
          if ((uVar3 < uVar36) && (*(int *)(pBVar7 + uVar36) == (int)*plVar28)) {
            uVar48 = uVar36 + uVar31;
            plVar30 = (long *)(pBVar7 + uVar36);
            goto LAB_01f9f59a;
          }
        }
        plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + 1);
      }
      else {
        piVar35 = (int *)(pBVar5 + uVar38);
        if (uVar38 < uVar12) {
          piVar35 = (int *)(pBVar7 + (uVar38 - uVar31));
        }
        if (*piVar35 != *(int *)((long)plVar28 + 1)) goto LAB_01f9f2f3;
        plVar30 = (long *)((long)plVar28 + 1);
        pBVar25 = iEnd;
        if (uVar38 < uVar12) {
          pBVar25 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar28 + 5),(BYTE *)(piVar35 + 1),iEnd,pBVar25,
                            (BYTE *)iStart);
        uVar24 = (long)plVar30 - (long)src;
        plVar28 = (long *)seqStore->lit;
        if (plVar17 < plVar30) {
          ZSTD_safecopyLiterals((BYTE *)plVar28,(BYTE *)src,(BYTE *)plVar30,(BYTE *)plVar17);
LAB_01f9f3f1:
          seqStore->lit = seqStore->lit + uVar24;
          psVar19 = seqStore->sequences;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar46 = *(long *)((long)src + 8);
          *plVar28 = *src;
          plVar28[1] = lVar46;
          pBVar25 = seqStore->lit;
          if (0x10 < uVar24) {
            lVar46 = *(long *)((long)src + 0x18);
            *(long *)(pBVar25 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar25 + 0x18) = lVar46;
            if (0x20 < (long)uVar24) {
              lVar46 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar46 + 0x20);
                uVar13 = puVar2[1];
                pBVar26 = pBVar25 + lVar46 + 0x20;
                *(undefined8 *)pBVar26 = *puVar2;
                *(undefined8 *)(pBVar26 + 8) = uVar13;
                puVar2 = (undefined8 *)((long)src + lVar46 + 0x30);
                uVar13 = puVar2[1];
                *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar26 + 0x18) = uVar13;
                lVar46 = lVar46 + 0x20;
              } while (pBVar26 + 0x20 < pBVar25 + uVar24);
            }
            goto LAB_01f9f3f1;
          }
          seqStore->lit = pBVar25 + uVar24;
          psVar19 = seqStore->sequences;
        }
        lVar46 = sVar18 + 4;
        psVar19->litLength = (U16)uVar24;
        psVar19->offBase = 1;
        uVar24 = sVar18 + 1;
        UVar44 = local_118;
joined_r0x01f9f870:
        local_118 = UVar44;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar28 = (long *)(lVar46 + (long)plVar30);
        psVar19->mlBase = (U16)uVar24;
        seqStore->sequences = psVar19 + 1;
        src = plVar28;
        if (plVar28 <= plVar1) {
          uVar16 = UVar45 + 2;
          lVar46 = *(long *)(pBVar5 + uVar16);
          pUVar10[(ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar16;
          pUVar10[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
               ((int)plVar28 + -2) - iVar41;
          pUVar11[(ulong)(lVar46 * -0x30e4432340650000) >> (bVar23 & 0x3f)] = uVar16;
          pUVar11[(ulong)(*(long *)((long)plVar28 + -1) * -0x30e4432340650000) >> (bVar23 & 0x3f)] =
               ((int)plVar28 + -1) - iVar41;
          UVar44 = local_114;
          for (; local_114 = UVar44, src = plVar28, plVar28 <= plVar1;
              plVar28 = (long *)((long)plVar28 + sVar18 + 4)) {
            UVar44 = (int)plVar28 - iVar41;
            uVar16 = UVar44 - local_114;
            pBVar25 = pBVar5;
            if (uVar16 < uVar12) {
              pBVar25 = pBVar7 + -uVar33;
            }
            if (((uVar12 - 1) - uVar16 < 3) || (*(int *)(pBVar25 + uVar16) != (int)*plVar28)) break;
            pBVar26 = iEnd;
            if (uVar16 < uVar12) {
              pBVar26 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)(pBVar25 + uVar16) + 4),
                                iEnd,pBVar26,(BYTE *)iStart);
            plVar30 = (long *)seqStore->lit;
            if (plVar17 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar30,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar17)
              ;
            }
            else {
              lVar46 = plVar28[1];
              *plVar30 = *plVar28;
              plVar30[1] = lVar46;
            }
            psVar19 = seqStore->sequences;
            psVar19->litLength = 0;
            psVar19->offBase = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar19->mlBase = (U16)(sVar18 + 1);
            seqStore->sequences = psVar19 + 1;
            lVar46 = *plVar28;
            pUVar11[(ulong)(lVar46 * -0x30e4432340650000) >> (bVar23 & 0x3f)] = UVar44;
            pUVar10[(ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar44;
            UVar44 = local_118;
            local_118 = local_114;
          }
        }
      }
      goto LAB_01f9f1ee;
    }
  }
  else if (uVar16 == 7) {
    if (iVar43 != 0) {
      for (uVar24 = 0; uVar24 < (ulong)(4L << (bVar20 & 0x3f)); uVar24 = uVar24 + 0x40) {
      }
      for (uVar24 = 0; uVar24 < (ulong)(4L << (bVar21 & 0x3f)); uVar24 = uVar24 + 0x40) {
      }
    }
    plVar28 = (long *)((long)src + (ulong)(iVar42 == 0));
    bVar22 = 0x40 - cVar14;
    bVar23 = 0x40 - cVar15;
    plVar17 = (long *)(iEnd + -0x20);
LAB_01fa0452:
    if (plVar28 < plVar1) {
      lVar46 = *plVar28;
      uVar34 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
      uVar40 = (ulong)(lVar46 * -0x30e44323405a9d00) >> (bVar23 & 0x3f);
      uVar37 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (0x38 - bVar20 & 0x3f);
      uVar24 = (ulong)(lVar46 * -0x30e44323405a9d00) >> (0x38 - bVar21 & 0x3f);
      uVar16 = pUVar8[uVar37 >> 8];
      uVar36 = pUVar9[uVar24 >> 8];
      iVar43 = (int)plVar28;
      UVar45 = iVar43 - iVar41;
      uVar4 = pUVar10[uVar34];
      uVar48 = pUVar11[uVar40];
      UVar44 = UVar45 + 1;
      pUVar11[uVar40] = UVar45;
      uVar38 = UVar44 - local_118;
      pUVar10[uVar34] = UVar45;
      if ((uVar12 - 1) - uVar38 < 3) {
LAB_01fa0557:
        if (uVar12 < uVar4) {
          plVar30 = (long *)(pBVar5 + uVar4);
          if (*plVar30 != lVar46) goto LAB_01fa0597;
          sVar18 = ZSTD_count((BYTE *)(plVar28 + 1),(BYTE *)(plVar30 + 1),iEnd);
          lVar46 = sVar18 + 8;
          UVar44 = iVar43 - (int)plVar30;
          for (; ((iStart < plVar30 && (src < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
              plVar28 = (long *)((long)plVar28 + -1)) {
            plVar30 = (long *)((long)plVar30 + -1);
            lVar46 = lVar46 + 1;
          }
          goto LAB_01fa09e9;
        }
        if ((char)uVar37 == (char)uVar16) {
          uVar16 = uVar16 >> 8;
          if ((uVar3 < uVar16) && (*(long *)(pBVar7 + uVar16) == lVar46)) {
            plVar30 = (long *)(pBVar7 + uVar16);
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)(plVar28 + 1),pBVar7 + (ulong)uVar16 + 8,iEnd,mEnd,
                                (BYTE *)iStart);
            lVar46 = sVar18 + 8;
            UVar44 = UVar45 - (uVar16 + uVar31);
            for (; ((plVar32 < plVar30 && (src < plVar28)) &&
                   (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                plVar28 = (long *)((long)plVar28 + -1)) {
              plVar30 = (long *)((long)plVar30 + -1);
              lVar46 = lVar46 + 1;
            }
            goto LAB_01fa09e9;
          }
        }
LAB_01fa0597:
        if (uVar12 < uVar48) {
          plVar30 = (long *)(pBVar5 + uVar48);
          if ((int)*plVar30 == (int)*plVar28) {
LAB_01fa07fe:
            lVar46 = *(long *)((long)plVar28 + 1);
            uVar34 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
            uVar24 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (0x38 - bVar20 & 0x3f);
            plVar29 = (long *)((long)plVar28 + 1);
            uVar16 = pUVar10[uVar34];
            uVar36 = pUVar8[uVar24 >> 8];
            pUVar10[uVar34] = UVar44;
            if (uVar12 < uVar16) {
              plVar47 = (long *)(pBVar5 + uVar16);
              if (*plVar47 != lVar46) goto LAB_01fa094e;
              sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 9),(BYTE *)(plVar47 + 1),iEnd);
              lVar46 = sVar18 + 8;
              UVar44 = (int)plVar29 - (int)plVar47;
              for (; ((plVar28 = plVar29, iStart < plVar47 && (src < plVar29)) &&
                     (*(BYTE *)((long)plVar29 + -1) == *(BYTE *)((long)plVar47 + -1)));
                  plVar29 = (long *)((long)plVar29 + -1)) {
                plVar47 = (long *)((long)plVar47 + -1);
                lVar46 = lVar46 + 1;
              }
            }
            else {
              if ((char)uVar24 == (char)uVar36) {
                uVar36 = uVar36 >> 8;
                if ((uVar3 < uVar36) && (plVar47 = (long *)(pBVar7 + uVar36), *plVar47 == lVar46)) {
                  sVar18 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar28 + 9),(BYTE *)(plVar47 + 1),iEnd,mEnd,
                                      (BYTE *)iStart);
                  lVar46 = sVar18 + 8;
                  UVar44 = UVar44 - (uVar36 + uVar31);
                  for (; ((plVar28 = plVar29, plVar32 < plVar47 && (src < plVar29)) &&
                         (*(BYTE *)((long)plVar29 + -1) == *(BYTE *)((long)plVar47 + -1)));
                      plVar29 = (long *)((long)plVar29 + -1)) {
                    plVar47 = (long *)((long)plVar47 + -1);
                    lVar46 = lVar46 + 1;
                  }
                  goto LAB_01fa09e9;
                }
              }
LAB_01fa094e:
              if (uVar48 < uVar12) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)plVar30 + 4),iEnd,
                                    mEnd,(BYTE *)iStart);
                lVar46 = sVar18 + 4;
                UVar44 = UVar45 - uVar48;
                for (; ((plVar32 < plVar30 && (src < plVar28)) &&
                       (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                    plVar28 = (long *)((long)plVar28 + -1)) {
                  plVar30 = (long *)((long)plVar30 + -1);
                  lVar46 = lVar46 + 1;
                }
              }
              else {
                sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 4),(BYTE *)((long)plVar30 + 4),iEnd);
                lVar46 = sVar18 + 4;
                UVar44 = iVar43 - (int)plVar30;
                for (; ((iStart < plVar30 && (src < plVar28)) &&
                       (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar30 + -1)));
                    plVar28 = (long *)((long)plVar28 + -1)) {
                  plVar30 = (long *)((long)plVar30 + -1);
                  lVar46 = lVar46 + 1;
                }
              }
            }
LAB_01fa09e9:
            uVar24 = (long)plVar28 - (long)src;
            plVar30 = (long *)seqStore->lit;
            if (plVar17 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar30,(BYTE *)src,(BYTE *)plVar28,(BYTE *)plVar17);
LAB_01fa0a18:
              seqStore->lit = seqStore->lit + uVar24;
              psVar19 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              lVar27 = *(long *)((long)src + 8);
              *plVar30 = *src;
              plVar30[1] = lVar27;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                lVar27 = *(long *)((long)src + 0x18);
                *(long *)(pBVar25 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar25 + 0x18) = lVar27;
                if (0x20 < (long)uVar24) {
                  lVar27 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
                    uVar13 = puVar2[1];
                    pBVar26 = pBVar25 + lVar27 + 0x20;
                    *(undefined8 *)pBVar26 = *puVar2;
                    *(undefined8 *)(pBVar26 + 8) = uVar13;
                    puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
                    uVar13 = puVar2[1];
                    *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar26 + 0x18) = uVar13;
                    lVar27 = lVar27 + 0x20;
                  } while (pBVar26 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_01fa0a18;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar19 = seqStore->sequences;
            }
            psVar19->litLength = (U16)uVar24;
            psVar19->offBase = UVar44 + 3;
            uVar24 = lVar46 - 3;
            plVar30 = plVar28;
            local_114 = local_118;
            goto joined_r0x01fa0ad4;
          }
        }
        else if ((char)uVar24 == (char)uVar36) {
          uVar36 = uVar36 >> 8;
          if ((uVar3 < uVar36) && (*(int *)(pBVar7 + uVar36) == (int)*plVar28)) {
            uVar48 = uVar36 + uVar31;
            plVar30 = (long *)(pBVar7 + uVar36);
            goto LAB_01fa07fe;
          }
        }
        plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + 1);
      }
      else {
        piVar35 = (int *)(pBVar5 + uVar38);
        if (uVar38 < uVar12) {
          piVar35 = (int *)(pBVar7 + (uVar38 - uVar31));
        }
        if (*piVar35 != *(int *)((long)plVar28 + 1)) goto LAB_01fa0557;
        plVar30 = (long *)((long)plVar28 + 1);
        pBVar25 = iEnd;
        if (uVar38 < uVar12) {
          pBVar25 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar28 + 5),(BYTE *)(piVar35 + 1),iEnd,pBVar25,
                            (BYTE *)iStart);
        uVar24 = (long)plVar30 - (long)src;
        plVar28 = (long *)seqStore->lit;
        if (plVar17 < plVar30) {
          ZSTD_safecopyLiterals((BYTE *)plVar28,(BYTE *)src,(BYTE *)plVar30,(BYTE *)plVar17);
LAB_01fa0655:
          seqStore->lit = seqStore->lit + uVar24;
          psVar19 = seqStore->sequences;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar46 = *(long *)((long)src + 8);
          *plVar28 = *src;
          plVar28[1] = lVar46;
          pBVar25 = seqStore->lit;
          if (0x10 < uVar24) {
            lVar46 = *(long *)((long)src + 0x18);
            *(long *)(pBVar25 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar25 + 0x18) = lVar46;
            if (0x20 < (long)uVar24) {
              lVar46 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar46 + 0x20);
                uVar13 = puVar2[1];
                pBVar26 = pBVar25 + lVar46 + 0x20;
                *(undefined8 *)pBVar26 = *puVar2;
                *(undefined8 *)(pBVar26 + 8) = uVar13;
                puVar2 = (undefined8 *)((long)src + lVar46 + 0x30);
                uVar13 = puVar2[1];
                *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar26 + 0x18) = uVar13;
                lVar46 = lVar46 + 0x20;
              } while (pBVar26 + 0x20 < pBVar25 + uVar24);
            }
            goto LAB_01fa0655;
          }
          seqStore->lit = pBVar25 + uVar24;
          psVar19 = seqStore->sequences;
        }
        lVar46 = sVar18 + 4;
        psVar19->litLength = (U16)uVar24;
        psVar19->offBase = 1;
        uVar24 = sVar18 + 1;
        UVar44 = local_118;
joined_r0x01fa0ad4:
        local_118 = UVar44;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar28 = (long *)(lVar46 + (long)plVar30);
        psVar19->mlBase = (U16)uVar24;
        seqStore->sequences = psVar19 + 1;
        src = plVar28;
        if (plVar28 <= plVar1) {
          uVar16 = UVar45 + 2;
          lVar46 = *(long *)(pBVar5 + uVar16);
          pUVar10[(ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar16;
          pUVar10[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
               ((int)plVar28 + -2) - iVar41;
          pUVar11[(ulong)(lVar46 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = uVar16;
          pUVar11[(ulong)(*(long *)((long)plVar28 + -1) * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] =
               ((int)plVar28 + -1) - iVar41;
          UVar44 = local_114;
          for (; local_114 = UVar44, src = plVar28, plVar28 <= plVar1;
              plVar28 = (long *)((long)plVar28 + sVar18 + 4)) {
            UVar44 = (int)plVar28 - iVar41;
            uVar16 = UVar44 - local_114;
            pBVar25 = pBVar5;
            if (uVar16 < uVar12) {
              pBVar25 = pBVar7 + -uVar33;
            }
            if (((uVar12 - 1) - uVar16 < 3) || (*(int *)(pBVar25 + uVar16) != (int)*plVar28)) break;
            pBVar26 = iEnd;
            if (uVar16 < uVar12) {
              pBVar26 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)(pBVar25 + uVar16) + 4),
                                iEnd,pBVar26,(BYTE *)iStart);
            plVar30 = (long *)seqStore->lit;
            if (plVar17 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar30,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar17)
              ;
            }
            else {
              lVar46 = plVar28[1];
              *plVar30 = *plVar28;
              plVar30[1] = lVar46;
            }
            psVar19 = seqStore->sequences;
            psVar19->litLength = 0;
            psVar19->offBase = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar19->mlBase = (U16)(sVar18 + 1);
            seqStore->sequences = psVar19 + 1;
            lVar46 = *plVar28;
            pUVar11[(ulong)(lVar46 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = UVar44;
            pUVar10[(ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar44;
            UVar44 = local_118;
            local_118 = local_114;
          }
        }
      }
      goto LAB_01fa0452;
    }
  }
  else {
    if (iVar43 != 0) {
      for (uVar24 = 0; uVar24 < (ulong)(4L << (bVar20 & 0x3f)); uVar24 = uVar24 + 0x40) {
      }
      for (uVar24 = 0; uVar24 < (ulong)(4L << (bVar21 & 0x3f)); uVar24 = uVar24 + 0x40) {
      }
    }
    plVar17 = (long *)((long)src + (ulong)(iVar42 == 0));
    bVar22 = 0x40 - cVar14;
    bVar23 = 0x20 - cVar15;
    plVar28 = (long *)(iEnd + -0x20);
LAB_01fa0d70:
    if (plVar17 < plVar1) {
      lVar46 = *plVar17;
      uVar24 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
      uVar38 = (int)lVar46 * -0x61c8864f;
      uVar39 = uVar38 >> (bVar23 & 0x1f);
      uVar34 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (0x38 - bVar20 & 0x3f);
      uVar38 = uVar38 >> (0x18 - bVar21 & 0x1f);
      uVar16 = pUVar8[uVar34 >> 8];
      uVar36 = pUVar9[uVar38 >> 8];
      iVar43 = (int)plVar17;
      UVar45 = iVar43 - iVar41;
      uVar4 = pUVar10[uVar24];
      uVar48 = pUVar11[uVar39];
      UVar44 = UVar45 + 1;
      pUVar11[uVar39] = UVar45;
      uVar39 = UVar44 - local_118;
      pUVar10[uVar24] = UVar45;
      if ((uVar12 - 1) - uVar39 < 3) {
LAB_01fa0e6b:
        if (uVar12 < uVar4) {
          plVar30 = (long *)(pBVar5 + uVar4);
          if (*plVar30 != lVar46) goto LAB_01fa0eb0;
          sVar18 = ZSTD_count((BYTE *)(plVar17 + 1),(BYTE *)(plVar30 + 1),iEnd);
          lVar46 = sVar18 + 8;
          UVar44 = iVar43 - (int)plVar30;
          for (; ((plVar29 = plVar17, iStart < plVar30 && (src < plVar17)) &&
                 (*(BYTE *)((long)plVar17 + -1) == *(BYTE *)((long)plVar30 + -1)));
              plVar17 = (long *)((long)plVar17 + -1)) {
            plVar30 = (long *)((long)plVar30 + -1);
            lVar46 = lVar46 + 1;
          }
          goto LAB_01fa1317;
        }
        if ((char)uVar34 == (char)uVar16) {
          uVar16 = uVar16 >> 8;
          if ((uVar3 < uVar16) && (*(long *)(pBVar7 + uVar16) == lVar46)) {
            plVar30 = (long *)(pBVar7 + uVar16);
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)(plVar17 + 1),pBVar7 + (ulong)uVar16 + 8,iEnd,mEnd,
                                (BYTE *)iStart);
            lVar46 = sVar18 + 8;
            UVar44 = UVar45 - (uVar16 + uVar31);
            for (; ((plVar29 = plVar17, plVar32 < plVar30 && (src < plVar17)) &&
                   (*(BYTE *)((long)plVar17 + -1) == *(BYTE *)((long)plVar30 + -1)));
                plVar17 = (long *)((long)plVar17 + -1)) {
              plVar30 = (long *)((long)plVar30 + -1);
              lVar46 = lVar46 + 1;
            }
            goto LAB_01fa1317;
          }
        }
LAB_01fa0eb0:
        if (uVar12 < uVar48) {
          plVar30 = (long *)(pBVar5 + uVar48);
          if ((int)*plVar30 == (int)*plVar17) {
LAB_01fa111b:
            lVar46 = *(long *)((long)plVar17 + 1);
            uVar34 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
            uVar24 = (ulong)(lVar46 * -0x30e44323485a9b9d) >> (0x38 - bVar20 & 0x3f);
            plVar29 = (long *)((long)plVar17 + 1);
            uVar16 = pUVar10[uVar34];
            uVar36 = pUVar8[uVar24 >> 8];
            pUVar10[uVar34] = UVar44;
            if (uVar12 < uVar16) {
              plVar47 = (long *)(pBVar5 + uVar16);
              if (*plVar47 != lVar46) goto LAB_01fa1274;
              sVar18 = ZSTD_count((BYTE *)((long)plVar17 + 9),(BYTE *)(plVar47 + 1),iEnd);
              lVar46 = sVar18 + 8;
              UVar44 = (int)plVar29 - (int)plVar47;
              for (; ((iStart < plVar47 && (src < plVar29)) &&
                     (*(BYTE *)((long)plVar29 + -1) == *(BYTE *)((long)plVar47 + -1)));
                  plVar29 = (long *)((long)plVar29 + -1)) {
                plVar47 = (long *)((long)plVar47 + -1);
                lVar46 = lVar46 + 1;
              }
            }
            else {
              if ((char)uVar24 == (char)uVar36) {
                uVar36 = uVar36 >> 8;
                if ((uVar3 < uVar36) && (plVar47 = (long *)(pBVar7 + uVar36), *plVar47 == lVar46)) {
                  sVar18 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar17 + 9),(BYTE *)(plVar47 + 1),iEnd,mEnd,
                                      (BYTE *)iStart);
                  lVar46 = sVar18 + 8;
                  UVar44 = UVar44 - (uVar36 + uVar31);
                  for (; ((plVar32 < plVar47 && (src < plVar29)) &&
                         (*(BYTE *)((long)plVar29 + -1) == *(BYTE *)((long)plVar47 + -1)));
                      plVar29 = (long *)((long)plVar29 + -1)) {
                    plVar47 = (long *)((long)plVar47 + -1);
                    lVar46 = lVar46 + 1;
                  }
                  goto LAB_01fa1317;
                }
              }
LAB_01fa1274:
              if (uVar48 < uVar12) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar17 + 4),(BYTE *)((long)plVar30 + 4),iEnd,
                                    mEnd,(BYTE *)iStart);
                lVar46 = sVar18 + 4;
                UVar44 = UVar45 - uVar48;
                for (; ((plVar29 = plVar17, plVar32 < plVar30 && (src < plVar17)) &&
                       (*(BYTE *)((long)plVar17 + -1) == *(BYTE *)((long)plVar30 + -1)));
                    plVar17 = (long *)((long)plVar17 + -1)) {
                  plVar30 = (long *)((long)plVar30 + -1);
                  lVar46 = lVar46 + 1;
                }
              }
              else {
                sVar18 = ZSTD_count((BYTE *)((long)plVar17 + 4),(BYTE *)((long)plVar30 + 4),iEnd);
                lVar46 = sVar18 + 4;
                UVar44 = iVar43 - (int)plVar30;
                for (; ((plVar29 = plVar17, iStart < plVar30 && (src < plVar17)) &&
                       (*(BYTE *)((long)plVar17 + -1) == *(BYTE *)((long)plVar30 + -1)));
                    plVar17 = (long *)((long)plVar17 + -1)) {
                  plVar30 = (long *)((long)plVar30 + -1);
                  lVar46 = lVar46 + 1;
                }
              }
            }
LAB_01fa1317:
            uVar24 = (long)plVar29 - (long)src;
            plVar17 = (long *)seqStore->lit;
            if (plVar28 < plVar29) {
              ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)src,(BYTE *)plVar29,(BYTE *)plVar28);
LAB_01fa1340:
              seqStore->lit = seqStore->lit + uVar24;
              psVar19 = seqStore->sequences;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              lVar27 = *(long *)((long)src + 8);
              *plVar17 = *src;
              plVar17[1] = lVar27;
              pBVar25 = seqStore->lit;
              if (0x10 < uVar24) {
                lVar27 = *(long *)((long)src + 0x18);
                *(long *)(pBVar25 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar25 + 0x18) = lVar27;
                if (0x20 < (long)uVar24) {
                  lVar27 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
                    uVar13 = puVar2[1];
                    pBVar26 = pBVar25 + lVar27 + 0x20;
                    *(undefined8 *)pBVar26 = *puVar2;
                    *(undefined8 *)(pBVar26 + 8) = uVar13;
                    puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
                    uVar13 = puVar2[1];
                    *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar26 + 0x18) = uVar13;
                    lVar27 = lVar27 + 0x20;
                  } while (pBVar26 + 0x20 < pBVar25 + uVar24);
                }
                goto LAB_01fa1340;
              }
              seqStore->lit = pBVar25 + uVar24;
              psVar19 = seqStore->sequences;
            }
            psVar19->litLength = (U16)uVar24;
            psVar19->offBase = UVar44 + 3;
            uVar24 = lVar46 - 3;
            local_114 = local_118;
            goto joined_r0x01fa13fb;
          }
        }
        else if ((char)uVar38 == (char)uVar36) {
          uVar36 = uVar36 >> 8;
          if ((uVar3 < uVar36) && (*(int *)(pBVar7 + uVar36) == (int)*plVar17)) {
            uVar48 = uVar36 + uVar31;
            plVar30 = (long *)(pBVar7 + uVar36);
            goto LAB_01fa111b;
          }
        }
        plVar17 = (long *)((long)plVar17 + ((long)plVar17 - (long)src >> 8) + 1);
      }
      else {
        piVar35 = (int *)(pBVar5 + uVar39);
        if (uVar39 < uVar12) {
          piVar35 = (int *)(pBVar7 + (uVar39 - uVar31));
        }
        if (*piVar35 != *(int *)((long)plVar17 + 1)) goto LAB_01fa0e6b;
        plVar29 = (long *)((long)plVar17 + 1);
        pBVar25 = iEnd;
        if (uVar39 < uVar12) {
          pBVar25 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar17 + 5),(BYTE *)(piVar35 + 1),iEnd,pBVar25,
                            (BYTE *)iStart);
        uVar24 = (long)plVar29 - (long)src;
        plVar17 = (long *)seqStore->lit;
        if (plVar28 < plVar29) {
          ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)src,(BYTE *)plVar29,(BYTE *)plVar28);
LAB_01fa0f70:
          seqStore->lit = seqStore->lit + uVar24;
          psVar19 = seqStore->sequences;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar46 = *(long *)((long)src + 8);
          *plVar17 = *src;
          plVar17[1] = lVar46;
          pBVar25 = seqStore->lit;
          if (0x10 < uVar24) {
            lVar46 = *(long *)((long)src + 0x18);
            *(long *)(pBVar25 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar25 + 0x18) = lVar46;
            if (0x20 < (long)uVar24) {
              lVar46 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar46 + 0x20);
                uVar13 = puVar2[1];
                pBVar26 = pBVar25 + lVar46 + 0x20;
                *(undefined8 *)pBVar26 = *puVar2;
                *(undefined8 *)(pBVar26 + 8) = uVar13;
                puVar2 = (undefined8 *)((long)src + lVar46 + 0x30);
                uVar13 = puVar2[1];
                *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar26 + 0x18) = uVar13;
                lVar46 = lVar46 + 0x20;
              } while (pBVar26 + 0x20 < pBVar25 + uVar24);
            }
            goto LAB_01fa0f70;
          }
          seqStore->lit = pBVar25 + uVar24;
          psVar19 = seqStore->sequences;
        }
        lVar46 = sVar18 + 4;
        psVar19->litLength = (U16)uVar24;
        psVar19->offBase = 1;
        uVar24 = sVar18 + 1;
        UVar44 = local_118;
joined_r0x01fa13fb:
        local_118 = UVar44;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar17 = (long *)(lVar46 + (long)plVar29);
        psVar19->mlBase = (U16)uVar24;
        seqStore->sequences = psVar19 + 1;
        src = plVar17;
        if (plVar17 <= plVar1) {
          uVar16 = UVar45 + 2;
          pUVar10[(ulong)(*(long *)(pBVar5 + uVar16) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
               uVar16;
          pUVar10[(ulong)(*(long *)((long)plVar17 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
               ((int)plVar17 + -2) - iVar41;
          pUVar11[(uint)(*(int *)(pBVar5 + uVar16) * -0x61c8864f) >> (bVar23 & 0x1f)] = uVar16;
          pUVar11[(uint)(*(int *)((long)plVar17 + -1) * -0x61c8864f) >> (bVar23 & 0x1f)] =
               ((int)plVar17 + -1) - iVar41;
          UVar44 = local_114;
          for (; local_114 = UVar44, src = plVar17, plVar17 <= plVar1;
              plVar17 = (long *)((long)plVar17 + sVar18 + 4)) {
            UVar44 = (int)plVar17 - iVar41;
            uVar16 = UVar44 - local_114;
            pBVar25 = pBVar5;
            if (uVar16 < uVar12) {
              pBVar25 = pBVar7 + -uVar33;
            }
            if (((uVar12 - 1) - uVar16 < 3) || (*(int *)(pBVar25 + uVar16) != (int)*plVar17)) break;
            pBVar26 = iEnd;
            if (uVar16 < uVar12) {
              pBVar26 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar17 + 4),(BYTE *)((long)(pBVar25 + uVar16) + 4),
                                iEnd,pBVar26,(BYTE *)iStart);
            plVar30 = (long *)seqStore->lit;
            if (plVar28 < plVar17) {
              ZSTD_safecopyLiterals((BYTE *)plVar30,(BYTE *)plVar17,(BYTE *)plVar17,(BYTE *)plVar28)
              ;
            }
            else {
              lVar46 = plVar17[1];
              *plVar30 = *plVar17;
              plVar30[1] = lVar46;
            }
            psVar19 = seqStore->sequences;
            psVar19->litLength = 0;
            psVar19->offBase = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar19->mlBase = (U16)(sVar18 + 1);
            seqStore->sequences = psVar19 + 1;
            pUVar11[(uint)((int)*plVar17 * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar44;
            pUVar10[(ulong)(*plVar17 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar44;
            UVar44 = local_118;
            local_118 = local_114;
          }
        }
      }
      goto LAB_01fa0d70;
    }
  }
  *rep = local_118;
  rep[1] = local_114;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}